

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdict.h
# Opt level: O1

int __thiscall
CVmHashEntryDict::del_entry
          (CVmHashEntryDict *this,CVmHashTable *table,vm_obj_id_t obj,vm_prop_id_t prop)

{
  vm_dict_entry *pvVar1;
  vm_dict_entry *pvVar2;
  vm_dict_entry **ppvVar3;
  vm_dict_entry *pvVar4;
  int iVar5;
  
  if (this->list_ == (vm_dict_entry *)0x0) {
    iVar5 = 0;
  }
  else {
    iVar5 = 0;
    pvVar2 = (vm_dict_entry *)0x0;
    pvVar4 = this->list_;
    do {
      pvVar1 = pvVar4->nxt_;
      if ((pvVar4->obj_ == obj) && (pvVar4->prop_ == prop)) {
        ppvVar3 = &pvVar2->nxt_;
        if (pvVar2 == (vm_dict_entry *)0x0) {
          ppvVar3 = &this->list_;
        }
        *ppvVar3 = pvVar1;
        operator_delete(pvVar4,0x18);
        iVar5 = 1;
      }
      pvVar2 = pvVar4;
      pvVar4 = pvVar1;
    } while (pvVar1 != (vm_dict_entry *)0x0);
  }
  if (this->list_ == (vm_dict_entry *)0x0) {
    CVmHashTable::remove(table,(char *)this);
    (*(this->super_CVmHashEntryCS).super_CVmHashEntry._vptr_CVmHashEntry[1])(this);
  }
  return iVar5;
}

Assistant:

int del_entry(CVmHashTable *table, vm_obj_id_t obj, vm_prop_id_t prop)
    {
        vm_dict_entry *cur;
        vm_dict_entry *nxt;
        vm_dict_entry *prv;
        int found;

        /* find the entry in our list */
        for (found = FALSE, prv = 0, cur = list_ ; cur != 0 ;
             prv = cur, cur = nxt)
        {
            /* remember the next entry */
            nxt = cur->nxt_;

            /* if this is our entry, delete it */
            if (cur->obj_ == obj && cur->prop_ == prop)
            {
                /* unlink this entry */
                if (prv != 0)
                    prv->nxt_ = nxt;
                else
                    list_ = nxt;

                /* delete this entry */
                delete cur;

                /* note that we found at least one entry to delete */
                found = TRUE;
            }
        }

        /* if our list is now empty, delete myself from the table */
        if (list_ == 0)
        {
            /* remove myself from the table */
            table->remove(this);

            /* delete myself */
            delete this;
        }

        /* tell the caller whether we found anything to delete */
        return found;
    }